

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O3

void av1_idct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int8_t *piVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  undefined7 in_register_00000011;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int32_t iVar13;
  int64_t min_value;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int32_t step [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_6c;
  int local_64;
  undefined8 local_60;
  int8_t *local_50;
  ulong local_48;
  int local_40;
  undefined4 uStack_3c;
  long local_38;
  
  uVar15 = CONCAT71(in_register_00000011,cos_bit) & 0xffffffff;
  lVar17 = (long)(int)CONCAT71(in_register_00000011,cos_bit);
  lVar18 = lVar17 * 0x100;
  *output = *input;
  output[1] = input[8];
  output[2] = input[4];
  output[3] = input[0xc];
  output[4] = input[2];
  output[5] = input[10];
  output[6] = input[6];
  output[7] = input[0xe];
  output[8] = input[1];
  output[9] = input[9];
  output[10] = input[5];
  output[0xb] = input[0xd];
  output[0xc] = input[3];
  output[0xd] = input[0xb];
  output[0xe] = input[7];
  output[0xf] = input[0xf];
  local_50 = stage_range;
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  piVar4 = local_50;
  local_98 = *(undefined8 *)output;
  uStack_90 = *(undefined8 *)(output + 2);
  local_88 = *(undefined8 *)(output + 4);
  uStack_80 = *(undefined8 *)(output + 6);
  lVar14 = 1L << (cos_bit - 1U & 0x3f);
  bVar7 = (byte)uVar15;
  local_78._0_4_ =
       (int32_t)(output[8] * *(int *)(&DAT_00d145f0 + lVar18) + lVar14 +
                 (long)-(LoadMaskz2[lVar17 * 8 + 6][4] * output[0xf]) >> (bVar7 & 0x3f));
  iVar5 = *(int *)(&DAT_00d14570 + lVar18);
  _local_40 = CONCAT44(uStack_3c,iVar5);
  local_78._4_4_ =
       (int)(output[9] * iVar5 + lVar14 + (long)-(*(int *)(&DAT_00d14590 + lVar18) * output[0xe]) >>
            (bVar7 & 0x3f));
  local_70 = (int)(output[10] * *(int *)(&DAT_00d145b0 + lVar18) + lVar14 +
                   (long)-(*(int *)(&DAT_00d14550 + lVar17 * 0x20) * output[0xd]) >>
                  (cos_bit & 0x3fU));
  local_6c._0_4_ =
       (int)(output[0xb] * LoadMaskz2[lVar17 * 8 + 7][4] + lVar14 +
             (long)-(*(int *)(&DAT_00d145d0 + lVar18) * output[0xc]) >> (bVar7 & 0x3f));
  local_6c._4_4_ =
       (int)(*(int *)(&DAT_00d145d0 + lVar18) * output[0xb] + lVar14 +
             (long)(output[0xc] * LoadMaskz2[lVar17 * 8 + 7][4]) >> (bVar7 & 0x3f));
  local_64 = (int)(*(int *)(&DAT_00d14550 + lVar17 * 0x20) * output[10] + lVar14 +
                   (long)(output[0xd] * *(int *)(&DAT_00d145b0 + lVar18)) >> (cos_bit & 0x3fU));
  iVar10 = LoadMaskz2[lVar17 * 8 + 7][0];
  local_60._0_4_ =
       (int)(*(int *)(&DAT_00d14590 + lVar18) * output[9] + lVar14 + (long)(output[0xe] * iVar5) >>
            (cos_bit & 0x3fU));
  local_60._4_4_ =
       (int32_t)(LoadMaskz2[lVar17 * 8 + 6][4] * output[8] + lVar14 +
                 (long)(output[0xf] * *(int *)(&DAT_00d145f0 + lVar18)) >> (cos_bit & 0x3fU));
  local_48 = uVar15;
  local_38 = lVar18;
  av1_range_check_buf(2,input,(int32_t *)&local_98,0x10,local_50[2]);
  *(undefined8 *)output = local_98;
  *(undefined8 *)(output + 2) = uStack_90;
  iVar5 = *(int *)(&DAT_00d145e0 + lVar18);
  bVar7 = (byte)local_48;
  output[4] = (int32_t)((int)local_88 * iVar5 + lVar14 + (long)-(iVar10 * uStack_80._4_4_) >>
                       (bVar7 & 0x3f));
  iVar2 = *(int *)(&DAT_00d14560 + lVar17 * 0x20);
  iVar3 = *(int *)(&DAT_00d145a0 + lVar18);
  output[5] = (int32_t)(local_88._4_4_ * iVar2 + lVar14 + (long)-(iVar3 * (int)uStack_80) >>
                       (bVar7 & 0x3f));
  output[6] = (int32_t)(iVar3 * local_88._4_4_ + lVar14 + (long)((int)uStack_80 * iVar2) >>
                       (bVar7 & 0x3f));
  output[7] = (int32_t)(iVar10 * (int)local_88 + lVar14 + (long)(uStack_80._4_4_ * iVar5) >>
                       (bVar7 & 0x3f));
  iVar5 = local_78._4_4_ + (int32_t)local_78;
  if ('\0' < piVar4[3]) {
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar11 = (long)iVar5;
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[8] = iVar5;
  iVar5 = (int32_t)local_78 - local_78._4_4_;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[9] = iVar5;
  iVar5 = (int)local_6c - local_70;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[10] = iVar5;
  iVar5 = (int)local_6c + local_70;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[0xb] = iVar5;
  iVar5 = local_64 + local_6c._4_4_;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[0xc] = iVar5;
  iVar5 = local_6c._4_4_ - local_64;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[0xd] = iVar5;
  iVar5 = local_60._4_4_ - (int)local_60;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[0xe] = iVar5;
  iVar5 = local_60._4_4_ + (int)local_60;
  if ('\0' < piVar4[3]) {
    lVar11 = (long)iVar5;
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar11 < lVar12 + -1) {
      lVar6 = lVar11;
    }
    lVar16 = -lVar12;
    if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
      lVar16 = lVar6;
    }
    iVar5 = (int)lVar16;
  }
  output[0xf] = iVar5;
  av1_range_check_buf(3,input,output,0x10,piVar4[3]);
  iVar5 = *(int *)(&DAT_00d14580 + lVar18);
  lVar11 = (long)iVar5;
  lVar6 = *output * lVar11 + lVar14;
  local_98._0_4_ = (int)(output[1] * iVar5 + lVar6 >> (bVar7 & 0x3f));
  iVar8 = -iVar5;
  local_98._4_4_ = (int)(output[1] * iVar8 + lVar6 >> (bVar7 & 0x3f));
  iVar10 = *(int *)(&DAT_00d14540 + lVar17 * 0x20);
  iVar2 = *(int *)(&DAT_00d145c0 + lVar18);
  iVar9 = -iVar10;
  uStack_90._0_4_ = (int)(output[2] * iVar2 + lVar14 + (long)(output[3] * iVar9) >> (bVar7 & 0x3f));
  uStack_90._4_4_ = (int)(iVar10 * output[2] + lVar14 + (long)(output[3] * iVar2) >> (bVar7 & 0x3f))
  ;
  local_88._4_4_ = output[4];
  iVar3 = output[5];
  local_88._0_4_ = iVar3 + local_88._4_4_;
  cVar1 = piVar4[4];
  if (cVar1 < '\x01') {
    local_88._4_4_ = local_88._4_4_ - iVar3;
    uStack_80._0_4_ = output[7] - output[6];
    uStack_80._4_4_ = output[7] + output[6];
  }
  else {
    lVar6 = 1L << (cVar1 - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    lVar12 = -lVar6;
    lVar16 = (long)(int)local_88;
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    local_88._0_4_ = (int)lVar18;
    lVar16 = (long)(local_88._4_4_ - iVar3);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    local_88._4_4_ = (int)lVar18;
    lVar16 = (long)(output[7] - output[6]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    uStack_80._0_4_ = (int)lVar18;
    lVar18 = (long)(output[7] + output[6]);
    if (lVar18 < lVar17) {
      lVar17 = lVar18;
    }
    if (SBORROW8(lVar18,lVar12) != lVar18 + lVar6 < 0) {
      lVar17 = lVar12;
    }
    uStack_80._4_4_ = (int)lVar17;
  }
  local_78._0_4_ = output[8];
  local_78._4_4_ = (int)(output[0xe] * iVar2 + lVar14 + (long)(output[9] * iVar9) >> (bVar7 & 0x3f))
  ;
  local_70 = (int)(-(iVar2 * output[10]) + lVar14 + (long)(output[0xd] * iVar9) >> (bVar7 & 0x3f));
  local_6c = *(undefined8 *)(output + 0xb);
  local_64 = (int)(output[0xd] * iVar2 + lVar14 + (long)(output[10] * iVar9) >> (bVar7 & 0x3f));
  local_60._0_4_ =
       (int)(output[9] * iVar2 + lVar14 + (long)(iVar10 * output[0xe]) >> (bVar7 & 0x3f));
  local_60._4_4_ = output[0xf];
  av1_range_check_buf(4,input,(int32_t *)&local_98,0x10,cVar1);
  piVar4 = local_50;
  iVar10 = uStack_90._4_4_ + (int)local_98;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  *output = iVar10;
  iVar10 = (int)uStack_90 + local_98._4_4_;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[1] = iVar10;
  iVar10 = local_98._4_4_ - (int)uStack_90;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[2] = iVar10;
  iVar10 = (int)local_98 - uStack_90._4_4_;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[3] = iVar10;
  output[4] = (int)local_88;
  lVar17 = (int)uStack_80 * lVar11 + lVar14;
  output[5] = (int32_t)(local_88._4_4_ * iVar8 + lVar17 >> (bVar7 & 0x3f));
  output[6] = (int32_t)(iVar5 * local_88._4_4_ + lVar17 >> (bVar7 & 0x3f));
  output[7] = uStack_80._4_4_;
  iVar10 = (int)local_6c + (int32_t)local_78;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[8] = iVar10;
  iVar10 = local_70 + local_78._4_4_;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[9] = iVar10;
  iVar10 = local_78._4_4_ - local_70;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[10] = iVar10;
  iVar10 = (int32_t)local_78 - (int)local_6c;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[0xb] = iVar10;
  iVar10 = local_60._4_4_ - local_6c._4_4_;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[0xc] = iVar10;
  iVar13 = (int)local_60 - local_64;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar13;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar13 = (int32_t)lVar12;
  }
  output[0xd] = iVar13;
  iVar10 = (int)local_60 + local_64;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[0xe] = iVar10;
  iVar10 = local_60._4_4_ + local_6c._4_4_;
  if ('\0' < local_50[5]) {
    lVar18 = (long)iVar10;
    lVar6 = 1L << (local_50[5] - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    if (lVar18 < lVar6 + -1) {
      lVar17 = lVar18;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar18,-lVar6) == lVar18 + lVar6 < 0) {
      lVar12 = lVar17;
    }
    iVar10 = (int)lVar12;
  }
  output[0xf] = iVar10;
  av1_range_check_buf(5,input,output,0x10,local_50[5]);
  uStack_80._4_4_ = *output;
  iVar10 = output[7];
  local_98._0_4_ = iVar10 + uStack_80._4_4_;
  cVar1 = piVar4[6];
  if (cVar1 < '\x01') {
    local_98._4_4_ = output[6] + output[1];
    uStack_90._0_4_ = output[5] + output[2];
    uStack_90._4_4_ = output[4] + output[3];
    local_88._0_4_ = output[3] - output[4];
    local_88._4_4_ = output[2] - output[5];
    uStack_80._0_4_ = output[1] - output[6];
    uStack_80._4_4_ = uStack_80._4_4_ - iVar10;
  }
  else {
    lVar6 = 1L << (cVar1 - 1U & 0x3f);
    lVar17 = lVar6 + -1;
    lVar12 = -lVar6;
    lVar16 = (long)(int)local_98;
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    iVar2 = (int)lVar12;
    local_98._0_4_ = (int)lVar18;
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      local_98._0_4_ = iVar2;
    }
    lVar16 = (long)(output[6] + output[1]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    local_98._4_4_ = (int)lVar18;
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      local_98._4_4_ = iVar2;
    }
    lVar16 = (long)(output[5] + output[2]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    uStack_90._0_4_ = (int)lVar18;
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      uStack_90._0_4_ = iVar2;
    }
    lVar16 = (long)(output[4] + output[3]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    uStack_90._4_4_ = (int)lVar18;
    lVar16 = (long)(output[3] - output[4]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    local_88._0_4_ = (int)lVar18;
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      local_88._0_4_ = iVar2;
    }
    lVar16 = (long)(output[2] - output[5]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    local_88._4_4_ = (int)lVar18;
    lVar16 = (long)(output[1] - output[6]);
    lVar18 = lVar17;
    if (lVar16 < lVar17) {
      lVar18 = lVar16;
    }
    if (SBORROW8(lVar16,lVar12) != lVar16 + lVar6 < 0) {
      lVar18 = lVar12;
    }
    uStack_80._0_4_ = (int)lVar18;
    lVar18 = (long)(uStack_80._4_4_ - iVar10);
    if (lVar18 < lVar17) {
      lVar17 = lVar18;
    }
    if (SBORROW8(lVar18,lVar12) != lVar18 + lVar6 < 0) {
      lVar17 = lVar12;
    }
    uStack_80._4_4_ = (int)lVar17;
  }
  local_78 = *(undefined8 *)(output + 8);
  lVar17 = output[0xd] * lVar11 + lVar14;
  local_70 = (int)(output[10] * iVar8 + lVar17 >> (bVar7 & 0x3f));
  lVar14 = output[0xc] * lVar11 + lVar14;
  local_6c._0_4_ = (int)(iVar8 * output[0xb] + lVar14 >> (bVar7 & 0x3f));
  local_6c._4_4_ = (int)(iVar5 * output[0xb] + lVar14 >> (bVar7 & 0x3f));
  local_64 = (int)(iVar5 * output[10] + lVar17 >> (bVar7 & 0x3f));
  local_60 = *(undefined8 *)(output + 0xe);
  av1_range_check_buf(6,input,(int32_t *)&local_98,0x10,cVar1);
  iVar5 = local_60._4_4_ + (int)local_98;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  *output = iVar5;
  iVar5 = (int)local_60 + local_98._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[1] = iVar5;
  iVar5 = local_64 + (int)uStack_90;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[2] = iVar5;
  iVar5 = local_6c._4_4_ + uStack_90._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[3] = iVar5;
  iVar5 = (int)local_6c + (int)local_88;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[4] = iVar5;
  iVar5 = local_70 + local_88._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[5] = iVar5;
  iVar5 = local_78._4_4_ + (int)uStack_80;
  if ('\0' < local_50[7]) {
    lVar17 = (long)iVar5;
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    lVar6 = -lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      lVar6 = lVar14;
    }
    iVar5 = (int)lVar6;
  }
  output[6] = iVar5;
  iVar5 = (int32_t)local_78 + uStack_80._4_4_;
  if ('\0' < local_50[7]) {
    lVar18 = (long)iVar5;
    lVar17 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar17 + -1;
    if (lVar18 < lVar17 + -1) {
      lVar14 = lVar18;
    }
    iVar5 = (int)-lVar17;
    if (SBORROW8(lVar18,-lVar17) == lVar18 + lVar17 < 0) {
      iVar5 = (int)lVar14;
    }
  }
  output[7] = iVar5;
  iVar5 = uStack_80._4_4_ - (int32_t)local_78;
  if ('\0' < local_50[7]) {
    lVar17 = (long)(uStack_80._4_4_ - (int32_t)local_78);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int32_t)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int32_t)lVar14;
    }
  }
  output[8] = iVar5;
  iVar5 = (int)uStack_80 - local_78._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)((int)uStack_80 - local_78._4_4_);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int)lVar14;
    }
  }
  output[9] = iVar5;
  iVar5 = local_88._4_4_ - local_70;
  if ('\0' < local_50[7]) {
    lVar17 = (long)(local_88._4_4_ - local_70);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int32_t)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int32_t)lVar14;
    }
  }
  output[10] = iVar5;
  iVar5 = (int)local_88 - (int)local_6c;
  if ('\0' < local_50[7]) {
    lVar17 = (long)((int)local_88 - (int)local_6c);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int32_t)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int32_t)lVar14;
    }
  }
  output[0xb] = iVar5;
  iVar5 = uStack_90._4_4_ - local_6c._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)(uStack_90._4_4_ - local_6c._4_4_);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int32_t)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int32_t)lVar14;
    }
  }
  output[0xc] = iVar5;
  iVar5 = (int)uStack_90 - local_64;
  if ('\0' < local_50[7]) {
    lVar17 = (long)((int)uStack_90 - local_64);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int32_t)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int32_t)lVar14;
    }
  }
  output[0xd] = iVar5;
  iVar5 = local_98._4_4_ - (int)local_60;
  if ('\0' < local_50[7]) {
    lVar17 = (long)(local_98._4_4_ - (int)local_60);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int)lVar14;
    }
  }
  output[0xe] = iVar5;
  iVar5 = (int)local_98 - local_60._4_4_;
  if ('\0' < local_50[7]) {
    lVar17 = (long)((int)local_98 - local_60._4_4_);
    lVar18 = 1L << (local_50[7] - 1U & 0x3f);
    lVar14 = lVar18 + -1;
    if (lVar17 < lVar18 + -1) {
      lVar14 = lVar17;
    }
    iVar5 = (int)-lVar18;
    if (SBORROW8(lVar17,-lVar18) == lVar17 + lVar18 < 0) {
      iVar5 = (int)lVar14;
    }
  }
  output[0xf] = iVar5;
  return;
}

Assistant:

void av1_idct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[8];
  bf1[2] = input[4];
  bf1[3] = input[12];
  bf1[4] = input[2];
  bf1[5] = input[10];
  bf1[6] = input[6];
  bf1[7] = input[14];
  bf1[8] = input[1];
  bf1[9] = input[9];
  bf1[10] = input[5];
  bf1[11] = input[13];
  bf1[12] = input[3];
  bf1[13] = input[11];
  bf1[14] = input[7];
  bf1[15] = input[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], -cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], -cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], -cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], -cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[52], bf0[11], cospi[12], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[20], bf0[10], cospi[44], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[36], bf0[9], cospi[28], bf0[14], cos_bit);
  bf1[15] = half_btf(cospi[4], bf0[8], cospi[60], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  bf1[8] = clamp_value(bf0[8] + bf0[9], stage_range[stage]);
  bf1[9] = clamp_value(bf0[8] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(-bf0[10] + bf0[11], stage_range[stage]);
  bf1[11] = clamp_value(bf0[10] + bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[13], stage_range[stage]);
  bf1[13] = clamp_value(bf0[12] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(-bf0[14] + bf0[15], stage_range[stage]);
  bf1[15] = clamp_value(bf0[14] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(-cospi[16], bf0[10], cospi[48], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[48], bf0[9], cospi[16], bf0[14], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = clamp_value(bf0[8] + bf0[11], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[10], stage_range[stage]);
  bf1[10] = clamp_value(bf0[9] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[8] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(-bf0[12] + bf0[15], stage_range[stage]);
  bf1[13] = clamp_value(-bf0[13] + bf0[14], stage_range[stage]);
  bf1[14] = clamp_value(bf0[13] + bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[12] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[15], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[14], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[13], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[12], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[11], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[10], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[9], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[8], stage_range[stage]);
  bf1[8] = clamp_value(bf0[7] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[6] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[5] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[4] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[3] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[2] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[1] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[0] - bf0[15], stage_range[stage]);
}